

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Vocoder.cpp
# Opt level: O0

int Vocoder::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  float fVar2;
  EffectData *pEVar3;
  Band *pBVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float env;
  float source;
  float carrier;
  Band *b_end;
  Band *b;
  float sum;
  float sidechainInput;
  float input;
  int i_1;
  uint n;
  float *sidechainBuffer;
  int i;
  float cs;
  float rs;
  float ca;
  float ra;
  float w;
  float f;
  int j;
  float emph;
  float envdecay;
  float w0;
  float sampletime;
  float maxfreq;
  float gain;
  Data *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar3 = UnityAudioEffectState::GetEffectData<Vocoder::EffectData>(state);
  sampletime = powf(10.0,(pEVar3->field_0).data.p[0] * 0.05 + 2.5);
  fVar5 = (float)(state->field_0).field_0.samplerate * 0.25;
  fVar6 = 1.0 / (float)(state->field_0).field_0.samplerate;
  fVar7 = powf(0.001,fVar6 / (pEVar3->field_0).data.p[5]);
  fVar1 = (pEVar3->field_0).data.p[6];
  for (w = 0.0; (int)w < 0xb; w = (float)((int)w + 1)) {
    ra = (*(float *)(freqs + (long)(int)w * 4) * (pEVar3->field_0).data.p[2] +
         (pEVar3->field_0).data.p[1]) * 0.25;
    if (10.0 <= ra) {
      if (fVar5 < ra) {
        ra = fVar5;
      }
    }
    else {
      ra = 10.0;
    }
    fVar8 = ra * fVar6 * 1.5707964;
    fVar10 = (pEVar3->field_0).data.p[3];
    fVar9 = sinf(fVar8);
    fVar2 = (pEVar3->field_0).data.p[4];
    fVar8 = sinf(fVar8);
    for (sidechainBuffer._0_4_ = 0; (int)sidechainBuffer < inchannels;
        sidechainBuffer._0_4_ = (int)sidechainBuffer + 1) {
      *(float *)((long)&pEVar3->field_0 +
                (long)(int)w * 0x44 + (long)(int)sidechainBuffer * 0x2ec + 0x1c) = fVar9 * 2.0;
      *(float *)((long)&pEVar3->field_0 +
                (long)(int)w * 0x44 + (long)(int)sidechainBuffer * 0x2ec + 0x2c) = fVar9 * 2.0;
      *(float *)((long)&pEVar3->field_0 +
                (long)(int)w * 0x44 + (long)(int)sidechainBuffer * 0x2ec + 0x20) = fVar10;
      *(float *)((long)&pEVar3->field_0 +
                (long)(int)w * 0x44 + (long)(int)sidechainBuffer * 0x2ec + 0x30) = fVar10;
      *(float *)((long)&pEVar3->field_0 +
                (long)(int)w * 0x44 + (long)(int)sidechainBuffer * 0x2ec + 0x3c) = fVar8 * 2.0;
      *(float *)((long)&pEVar3->field_0 +
                (long)(int)w * 0x44 + (long)(int)sidechainBuffer * 0x2ec + 0x4c) = fVar8 * 2.0;
      *(float *)((long)&pEVar3->field_0 +
                (long)(int)w * 0x44 + (long)(int)sidechainBuffer * 0x2ec + 0x40) = fVar2;
      *(float *)((long)&pEVar3->field_0 +
                (long)(int)w * 0x44 + (long)(int)sidechainBuffer * 0x2ec + 0x50) = fVar2;
    }
    sampletime = fVar1 * sampletime;
  }
  _i_1 = (state->field_0).field_0.sidechainbuffer;
  _inchannels_local = outbuffer;
  outbuffer_local = inbuffer;
  for (input = 0.0; (uint)input < length; input = (float)((int)input + 1)) {
    for (sidechainInput = 0.0; (int)sidechainInput < inchannels;
        sidechainInput = (float)((int)sidechainInput + 1)) {
      fVar1 = *outbuffer_local;
      fVar5 = *_i_1;
      b._4_4_ = 0.0;
      b_end = (Band *)((long)&pEVar3->field_0 + (long)(int)sidechainInput * 0x2ec + 0x1c);
      pBVar4 = b_end + 0xb;
      for (; b_end != pBVar4; b_end = b_end + 1) {
        fVar6 = StateVariableFilter::ProcessBPF(&b_end->synthesis1,fVar1 * sampletime + 1e-11);
        fVar6 = StateVariableFilter::ProcessBPF(&b_end->synthesis2,fVar6);
        fVar10 = StateVariableFilter::ProcessBPF(&b_end->analysis1,fVar5);
        fVar10 = StateVariableFilter::ProcessBPF(&b_end->analysis2,fVar10);
        fVar10 = EnvFollower::Process(&b_end->envfollow,fVar10,1.0 - fVar7);
        b._4_4_ = fVar6 * fVar10 + b._4_4_;
      }
      *_inchannels_local = b._4_4_;
      _i_1 = _i_1 + 1;
      _inchannels_local = _inchannels_local + 1;
      outbuffer_local = outbuffer_local + 1;
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        float gain = powf(10.0f, 0.05f * data->p[P_GAIN] + 2.5);
        float maxfreq = 0.25f * state->samplerate;
        float sampletime = 1.0f / (float)state->samplerate;
        float w0 = 0.5f * kPI * sampletime;
        float envdecay = 1.0f - powf(0.001f, sampletime / data->p[P_ENVDECAY]);
        float emph = data->p[P_EMPHASIS];
        for (int j = 0; j < NUMBANDS; j++)
        {
            float f = 0.25f * (freqs[j] * data->p[P_FMTSCALE] + data->p[P_FMTSHIFT]);
            if (f < 10.0f)
                f = 10.0f;
            else if (f > maxfreq)
                f = maxfreq;
            float w = f * w0;
            float ra = data->p[P_ANALYSISBW];
            float ca = 2.0f * sinf(w);
            float rs = data->p[P_SYNTHESISBW];
            float cs = 2.0f * sinf(w);
            for (int i = 0; i < inchannels; i++)
            {
                data->bands[i][j].analysis1.cutoff = ca;
                data->bands[i][j].analysis2.cutoff = ca;
                data->bands[i][j].analysis1.bandwidth = ra;
                data->bands[i][j].analysis2.bandwidth = ra;
                data->bands[i][j].synthesis1.cutoff = cs;
                data->bands[i][j].synthesis2.cutoff = cs;
                data->bands[i][j].synthesis1.bandwidth = rs;
                data->bands[i][j].synthesis2.bandwidth = rs;
            }
            gain *= emph;
        }

        float* sidechainBuffer = state->sidechainbuffer;
        for (unsigned int n = 0; n < length; n++)
        {
            for (int i = 0; i < inchannels; i++)
            {
                float input = (*inbuffer++) * gain + 1.0e-11f;
                float sidechainInput = *sidechainBuffer++;
                float sum = 0.0f;
                Band* b = data->bands[i];
                Band* b_end = b + NUMBANDS;
                while (b != b_end)
                {
                    float carrier = b->synthesis2.ProcessBPF(b->synthesis1.ProcessBPF(input));
                    float source = b->analysis2.ProcessBPF(b->analysis1.ProcessBPF(sidechainInput));
                    float env = b->envfollow.Process(source, envdecay);
                    sum += carrier * env;
                    ++b;
                }
                *outbuffer++ = sum;
            }
        }

        return UNITY_AUDIODSP_OK;
    }